

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O1

void wallet::wallet_tests::TestWatchOnlyPubKey(LegacyScriptPubKeyMan *spk_man,CPubKey *add_pubkey)

{
  assertion_result *paVar1;
  bool bVar2;
  bool bVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock45;
  CPubKey found_pubkey;
  CKeyID add_address;
  CScript p2pk;
  check_type cVar6;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  assertion_result local_248;
  char **local_230;
  assertion_result local_228;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  unique_lock<std::recursive_mutex> local_100;
  undefined1 local_f0 [24];
  char **local_d8;
  CPubKey local_ad;
  CKeyID local_6c;
  direct_or_indirect local_58;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  GetScriptForRawPubKey((CScript *)&local_58.indirect_contents,add_pubkey);
  CPubKey::GetID(&local_6c,add_pubkey);
  local_ad.vch[0] = 0xff;
  local_100._M_device =
       &(spk_man->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.
        super_recursive_mutex;
  local_100._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_100);
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1fe;
  file.m_begin = (iterator)&local_110;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_120,msg);
  bVar2 = LegacyDataSPKM::HaveWatchOnly
                    (&spk_man->super_LegacyDataSPKM,(CScript *)&local_58.indirect_contents);
  local_248.m_message.px = (element_type *)0x0;
  local_248.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8 = (char **)&local_228;
  local_228._0_8_ = "!spk_man->HaveWatchOnly(p2pk)";
  local_228.m_message.px = (element_type *)0xf87edf;
  local_f0[8] = false;
  local_f0._0_8_ = &PTR__lazy_ostream_013abc70;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_128 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_248.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  boost::test_tools::tt_detail::report_assertion
            (&local_248,(lazy_ostream *)local_f0,1,0,WARN,_cVar6,(size_t)&local_130,0x1fe);
  boost::detail::shared_count::~shared_count(&local_248.m_message.pn);
  LegacyDataSPKM::LoadWatchOnly
            (&spk_man->super_LegacyDataSPKM,(CScript *)&local_58.indirect_contents);
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x200;
  file_00.m_begin = (iterator)&local_140;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_150,
             msg_00);
  local_248.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       LegacyDataSPKM::HaveWatchOnly
                 (&spk_man->super_LegacyDataSPKM,(CScript *)&local_58.indirect_contents);
  local_248.m_message.px = (element_type *)0x0;
  local_248.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_228._0_8_ = "spk_man->HaveWatchOnly(p2pk)";
  local_228.m_message.px = (element_type *)0xf87edf;
  local_f0[8] = false;
  local_f0._0_8_ = &PTR__lazy_ostream_013abc70;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_d8 = (char **)&local_228;
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_158 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_248,(lazy_ostream *)local_f0,1,0,WARN,_cVar6,(size_t)&local_160,0x200);
  boost::detail::shared_count::~shared_count(&local_248.m_message.pn);
  bVar2 = CPubKey::IsFullyValid(add_pubkey);
  if (bVar2) {
    local_170 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_168 = "";
    local_180 = &boost::unit_test::basic_cstring<char_const>::null;
    local_178 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x205;
    file_01.m_begin = (iterator)&local_170;
    msg_01.m_end = pvVar5;
    msg_01.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_180,
               msg_01);
    local_248.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         LegacyDataSPKM::GetWatchPubKey(&spk_man->super_LegacyDataSPKM,&local_6c,&local_ad);
    local_248.m_message.px = (element_type *)0x0;
    local_248.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_228._0_8_ = "spk_man->GetWatchPubKey(add_address, found_pubkey)";
    local_228.m_message.px = (element_type *)0xf87f2e;
    local_f0[8] = false;
    local_f0._0_8_ = &PTR__lazy_ostream_013abc70;
    local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_d8 = (char **)&local_228;
    local_190 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_188 = "";
    pvVar4 = (iterator)0x1;
    pvVar5 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_248,(lazy_ostream *)local_f0,1,0,WARN,_cVar6,(size_t)&local_190,0x205);
    boost::detail::shared_count::~shared_count(&local_248.m_message.pn);
    local_1a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_198 = "";
    local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x206;
    file_02.m_begin = (iterator)&local_1a0;
    msg_02.m_end = pvVar5;
    msg_02.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1b0,
               msg_02);
    local_248.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)::operator==(&local_ad,add_pubkey);
    local_248.m_message.px = (element_type *)0x0;
    local_248.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_228._0_8_ = "found_pubkey == add_pubkey";
    local_228.m_message.px = (element_type *)0xf87efa;
    local_f0[8] = false;
    local_f0._0_8_ = &PTR__lazy_ostream_013abc70;
    local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_d8 = (char **)&local_228;
    local_1c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_1b8 = "";
    pvVar4 = (iterator)0x1;
    pvVar5 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_248,(lazy_ostream *)local_f0,1,0,WARN,_cVar6,(size_t)&local_1c0,0x206);
    paVar1 = &local_248;
  }
  else {
    local_1d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_1c8 = "";
    local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x208;
    file_03.m_begin = (iterator)&local_1d0;
    msg_03.m_end = pvVar5;
    msg_03.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1e0,
               msg_03);
    bVar3 = LegacyDataSPKM::GetWatchPubKey(&spk_man->super_LegacyDataSPKM,&local_6c,&local_ad);
    local_248.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)!bVar3;
    local_248.m_message.px = (element_type *)0x0;
    local_248.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_228._0_8_ = "!spk_man->GetWatchPubKey(add_address, found_pubkey)";
    local_228.m_message.px = (element_type *)0xf87f2e;
    local_f0[8] = false;
    local_f0._0_8_ = &PTR__lazy_ostream_013abc70;
    local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_d8 = (char **)&local_228;
    local_1f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_1e8 = "";
    pvVar4 = (iterator)0x1;
    pvVar5 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_248,(lazy_ostream *)local_f0,1,0,WARN,_cVar6,(size_t)&local_1f0,0x208);
    boost::detail::shared_count::~shared_count(&local_248.m_message.pn);
    local_200 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_1f8 = "";
    local_210 = &boost::unit_test::basic_cstring<char_const>::null;
    local_208 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x209;
    file_04.m_begin = (iterator)&local_200;
    msg_04.m_end = pvVar5;
    msg_04.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_210,
               msg_04);
    local_f0[0] = 0xff;
    bVar3 = ::operator==(&local_ad,(CPubKey *)local_f0);
    local_228.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar3;
    local_228.m_message.px = (element_type *)0x0;
    local_228.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_230 = &local_258;
    local_258 = "found_pubkey == CPubKey()";
    local_250 = "";
    local_248.m_message.px = (element_type *)((ulong)local_248.m_message.px & 0xffffffffffffff00);
    local_248._0_8_ = &PTR__lazy_ostream_013abc70;
    local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_268 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_260 = "";
    pvVar4 = (iterator)0x1;
    pvVar5 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_228,(lazy_ostream *)&local_248,1,0,WARN,_cVar6,(size_t)&local_268,0x209);
    paVar1 = &local_228;
  }
  boost::detail::shared_count::~shared_count((shared_count *)((long)paVar1 + 0x10));
  LegacyScriptPubKeyMan::RemoveWatchOnly(spk_man,(CScript *)&local_58.indirect_contents);
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x20d;
  file_05.m_begin = (iterator)&local_278;
  msg_05.m_end = pvVar5;
  msg_05.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_288,
             msg_05);
  bVar3 = LegacyDataSPKM::HaveWatchOnly
                    (&spk_man->super_LegacyDataSPKM,(CScript *)&local_58.indirect_contents);
  local_248.m_message.px = (element_type *)0x0;
  local_248.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_228._0_8_ = "!spk_man->HaveWatchOnly(p2pk)";
  local_228.m_message.px = (element_type *)0xf87edf;
  local_f0[8] = false;
  local_f0._0_8_ = &PTR__lazy_ostream_013abc70;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_d8 = (char **)&local_228;
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_290 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_248.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  boost::test_tools::tt_detail::report_assertion
            (&local_248,(lazy_ostream *)local_f0,1,0,WARN,_cVar6,(size_t)&local_298,0x20d);
  boost::detail::shared_count::~shared_count(&local_248.m_message.pn);
  if (bVar2) {
    local_2a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_2a0 = "";
    local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x210;
    file_06.m_begin = (iterator)&local_2a8;
    msg_06.m_end = pvVar5;
    msg_06.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2b8,
               msg_06);
    bVar2 = LegacyDataSPKM::GetWatchPubKey(&spk_man->super_LegacyDataSPKM,&local_6c,&local_ad);
    local_248.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)!bVar2;
    local_248.m_message.px = (element_type *)0x0;
    local_248.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_228._0_8_ = "!spk_man->GetWatchPubKey(add_address, found_pubkey)";
    local_228.m_message.px = (element_type *)0xf87f2e;
    local_f0[8] = false;
    local_f0._0_8_ = &PTR__lazy_ostream_013abc70;
    local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_d8 = (char **)&local_228;
    local_2c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_2c0 = "";
    pvVar4 = (iterator)0x1;
    pvVar5 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_248,(lazy_ostream *)local_f0,1,0,WARN,_cVar6,(size_t)&local_2c8,0x210);
    boost::detail::shared_count::~shared_count(&local_248.m_message.pn);
    local_2d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_2d0 = "";
    local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0x211;
    file_07.m_begin = (iterator)&local_2d8;
    msg_07.m_end = pvVar5;
    msg_07.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2e8,
               msg_07);
    local_248.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)::operator==(&local_ad,add_pubkey);
    local_248.m_message.px = (element_type *)0x0;
    local_248.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_228._0_8_ = "found_pubkey == add_pubkey";
    local_228.m_message.px = (element_type *)0xf87efa;
    local_f0[8] = false;
    local_f0._0_8_ = &PTR__lazy_ostream_013abc70;
    local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_d8 = (char **)&local_228;
    local_2f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_2f0 = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_248,(lazy_ostream *)local_f0,1,0,WARN,_cVar6,(size_t)&local_2f8,0x211);
    boost::detail::shared_count::~shared_count(&local_248.m_message.pn);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_100);
  if (0x1c < local_3c) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void TestWatchOnlyPubKey(LegacyScriptPubKeyMan* spk_man, const CPubKey& add_pubkey)
{
    CScript p2pk = GetScriptForRawPubKey(add_pubkey);
    CKeyID add_address = add_pubkey.GetID();
    CPubKey found_pubkey;
    LOCK(spk_man->cs_KeyStore);

    // all Scripts (i.e. also all PubKeys) are added to the general watch-only set
    BOOST_CHECK(!spk_man->HaveWatchOnly(p2pk));
    spk_man->LoadWatchOnly(p2pk);
    BOOST_CHECK(spk_man->HaveWatchOnly(p2pk));

    // only PubKeys on the curve shall be added to the watch-only address -> PubKey map
    bool is_pubkey_fully_valid = add_pubkey.IsFullyValid();
    if (is_pubkey_fully_valid) {
        BOOST_CHECK(spk_man->GetWatchPubKey(add_address, found_pubkey));
        BOOST_CHECK(found_pubkey == add_pubkey);
    } else {
        BOOST_CHECK(!spk_man->GetWatchPubKey(add_address, found_pubkey));
        BOOST_CHECK(found_pubkey == CPubKey()); // passed key is unchanged
    }

    spk_man->RemoveWatchOnly(p2pk);
    BOOST_CHECK(!spk_man->HaveWatchOnly(p2pk));

    if (is_pubkey_fully_valid) {
        BOOST_CHECK(!spk_man->GetWatchPubKey(add_address, found_pubkey));
        BOOST_CHECK(found_pubkey == add_pubkey); // passed key is unchanged
    }
}